

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PolynomialEvaluation.cpp
# Opt level: O2

PolyNf * __thiscall
Inferences::simplifyPoly<Kernel::NumTraits<Kernel::RationalConstantType>>
          (PolyNf *__return_storage_ptr__,Inferences *this,
          Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_> *in,PolyNf *simplifiedArgs,
          bool removeZeros)

{
  MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_> *this_00;
  bool bVar1;
  uint uVar2;
  undefined1 removeZeros_00;
  ulong uVar3;
  int local_1e0;
  byte local_1dc;
  Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_> local_1b8;
  StlIter __begin0;
  IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1775:65),_const_Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_&>_>
  local_180;
  Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_> local_160;
  Monom<Kernel::NumTraits<Kernel::RationalConstantType>_> fac;
  Monom<Kernel::NumTraits<Kernel::RationalConstantType>_> simpl;
  Monom monom;
  Monom<Kernel::NumTraits<Kernel::RationalConstantType>_> local_b0;
  RationalConstantType local_80;
  Monom<Kernel::NumTraits<Kernel::RationalConstantType>_> local_60;
  
  local_1b8._cursor = (Monom<Kernel::NumTraits<Kernel::RationalConstantType>_> *)0x0;
  local_1b8._end = (Monom<Kernel::NumTraits<Kernel::RationalConstantType>_> *)0x0;
  local_1b8._capacity = 0;
  local_1b8._stack = (Monom<Kernel::NumTraits<Kernel::RationalConstantType>_> *)0x0;
  uVar3 = 0;
  uVar2 = (uint)simplifiedArgs & 0xff;
  local_1e0 = 0;
  do {
    removeZeros_00 = 0x30;
    if (((*(long *)(this + 0x10) - *(long *)(this + 8)) / 0x30 & 0xffffffffU) <= uVar3) {
      Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_>::Stack
                (&local_160,&local_1b8);
      PolynomialEvaluation::simplifySummation<Kernel::NumTraits<Kernel::RationalConstantType>>
                (__return_storage_ptr__,(PolynomialEvaluation *)&local_160,
                 (Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_> *)
                 (ulong)uVar2,(bool)removeZeros_00);
      Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_>::~Stack
                (&local_160);
      Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_>::~Stack
                (&local_1b8);
      return __return_storage_ptr__;
    }
    Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>::Monom
              (&monom,(Monom<Kernel::NumTraits<Kernel::RationalConstantType>_> *)
                      (*(long *)(this + 8) + uVar3 * 0x30));
    simplifyMonom<Kernel::NumTraits<Kernel::RationalConstantType>>
              (&simpl,(Inferences *)&monom,
               (Monom<Kernel::NumTraits<Kernel::RationalConstantType>_> *)
               (&(in->_summands)._capacity + (long)local_1e0 * 3),(PolyNf *)(ulong)uVar2,removeZeros
              );
    bVar1 = Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>::isZeroMul(&simpl);
    local_1dc = (byte)simplifiedArgs;
    if ((local_1dc & bVar1) == 0) {
      this_00 = ((simpl.factors._ptr)->_factors)._stack;
      if ((int)(((long)((simpl.factors._ptr)->_factors)._cursor - (long)this_00) / 0x1c) == 1) {
        Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>::tryPolynom
                  ((Option<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>_>
                    *)&fac,this_00);
        if ((char)fac.numeral._num._val[0]._mp_alloc == '\x01') {
          Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>::tryPolynom
                    ((Option<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>_>
                      *)&fac,((simpl.factors._ptr)->_factors)._stack);
          local_180._iter._inner._to =
               (*(long *)(fac.numeral._den._val[0]._0_8_ + 0x10) -
               *(long *)(fac.numeral._den._val[0]._0_8_ + 8)) / 0x30;
          local_180._iter._inner._next = 0;
          local_180._iter._inner._from = 0;
          local_180._iter._func.a =
               (Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_> *)
               fac.numeral._den._val[0]._0_8_;
          Lib::
          IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1775:65),_const_Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_&>_>
          ::StlIter::StlIter(&__begin0,&local_180);
          while ((OptionBaseRef<const_Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_*>
                  )__begin0._cur.
                   super_OptionBase<const_Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_&>
                   .
                   super_OptionBaseRef<const_Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_*>
                   ._elem !=
                 (OptionBaseRef<const_Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_*>
                  )0x0) {
            Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>::Monom
                      (&fac,(Monom<Kernel::NumTraits<Kernel::RationalConstantType>_> *)
                            __begin0._cur.
                            super_OptionBase<const_Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_&>
                            .
                            super_OptionBaseRef<const_Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_*>
                            ._elem);
            Kernel::RationalConstantType::operator*(&local_80,&fac.numeral,&simpl.numeral);
            Kernel::RationalConstantType::operator=(&fac.numeral,&local_80);
            Kernel::RationalConstantType::~RationalConstantType(&local_80);
            Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>::Monom(&local_60,&fac);
            Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_>::push
                      (&local_1b8,&local_60);
            Kernel::RationalConstantType::~RationalConstantType(&local_60.numeral);
            Kernel::RationalConstantType::~RationalConstantType(&fac.numeral);
            Lib::
            IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1775:65),_const_Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_&>_>
            ::StlIter::operator++(&__begin0);
          }
          goto LAB_00412231;
        }
      }
      Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>::Monom(&local_b0,&simpl);
      Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_>::push
                (&local_1b8,&local_b0);
      Kernel::RationalConstantType::~RationalConstantType(&local_b0.numeral);
    }
LAB_00412231:
    local_1e0 = local_1e0 +
                (int)(((long)((monom.factors._ptr)->_factors)._cursor -
                      (long)((monom.factors._ptr)->_factors)._stack) / 0x1c);
    Kernel::RationalConstantType::~RationalConstantType(&simpl.numeral);
    Kernel::RationalConstantType::~RationalConstantType(&monom.numeral);
    uVar3 = uVar3 + 1;
  } while( true );
}

Assistant:

PolyNf simplifyPoly(Polynom<Number> const& in, PolyNf* simplifiedArgs, bool removeZeros)
{
  using Monom   = Monom<Number>;


  // first we simplify all the monoms containted in this polynom
  Stack<Monom> sum;
  {
    auto offs = 0;
    for (unsigned i = 0; i < in.nSummands(); i++) {
      auto monom  = in.summandAt(i);
      auto simpl = simplifyMonom(monom, &simplifiedArgs[offs], removeZeros);

      if (simpl.isZeroMul() && removeZeros) {
        /* we don't add it */
      } else if (simpl.factors->nFactors() == 1 && simpl.factors->factorAt(0).tryPolynom().isSome()) {
        /* k * (t1 + ... tn) ==> k * t1 + ... k * tn */
        auto poly = simpl.factors->factorAt(0).tryPolynom().unwrap();
        for (auto fac : poly->iterSummands()) {
          fac.numeral = fac.numeral * simpl.numeral;
          ASS(!removeZeros || fac.numeral != Number::constant(0))
          sum.push(fac);
        }
      } else {
        sum.push(simpl);
      }
      offs += monom.factors->nFactors();
    }
  }

  return PolynomialEvaluation::simplifySummation(std::move(sum), removeZeros);
}